

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpSuffixTreeToDotFile
          (GeneralizedSuffixTree *this,string *filename)

{
  char *__filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FILE *local_20;
  FILE *file;
  string *filename_local;
  GeneralizedSuffixTree *this_local;
  
  file = (FILE *)filename;
  filename_local = (string *)this;
  printf("Dumping tree...\n");
  __filename = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(__filename,"w");
  if (local_20 == (FILE *)0x0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Can not open file: ",&local_41);
    std::operator+(__return_storage_ptr__,&local_40,filename);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  fprintf(local_20,"digraph suffixtree\n{\n");
  DumpNode(this,this->root,(FILE *)local_20);
  fprintf(local_20,"}\n");
  fclose(local_20);
  printf("Tree was dumped successfully\n");
  return;
}

Assistant:

void GeneralizedSuffixTree::DumpSuffixTreeToDotFile (std::string filename)
{
    printf ("Dumping tree...\n");
    FILE *file = fopen (filename.c_str(), "w");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    fprintf (file, "digraph suffixtree\n{\n");
    DumpNode (root, file);
    fprintf (file, "}\n");
    fclose (file);
    printf ("Tree was dumped successfully\n");
}